

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O1

void __thiscall
moira::Moira::execAndiRg<(moira::Instr)10,(moira::Mode)0,(moira::Size)1>(Moira *this,u16 opcode)

{
  PrefetchQueue PVar1;
  u32 uVar2;
  uint uVar3;
  uint uVar4;
  
  PVar1 = this->queue;
  readExt(this);
  uVar3 = (uint)PVar1 & *(uint *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58);
  uVar4 = uVar3 & 0xff;
  (this->reg).sr.n = 0x7f < uVar4;
  (this->reg).sr.z = uVar4 == 0;
  (this->reg).sr.v = false;
  (this->reg).sr.c = false;
  uVar2 = (this->reg).pc;
  (this->reg).pc0 = uVar2;
  (this->queue).ird = (this->queue).irc;
  uVar2 = readM<(moira::MemSpace)2,(moira::Size)2,4ul>(this,uVar2 + 2);
  (this->queue).irc = (u16)uVar2;
  *(char *)((long)this->exec + (ulong)(opcode & 7) * 4 + -0x58) = (char)uVar3;
  return;
}

Assistant:

void
Moira::execAndiRg(u16 opcode)
{
    u32 src = readI<S>();
    int dst = _____________xxx(opcode);

    u32 result = logic<I,S>(src, readD<S>(dst));
    prefetch<POLLIPL>();

    if (S == Long) sync(4);
    writeD<S>(dst, result);
}